

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

int putn_verify_element_in_buf
              (Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld,Integer *ecoords,void *bufn
              ,Integer elemSize)

{
  Integer IVar1;
  long in_RCX;
  long *in_RSI;
  long in_R8;
  long *in_R9;
  Integer eoff;
  ptrdiff_t off;
  int ndims;
  int i;
  Integer in_stack_000001b0;
  long local_48;
  int local_34;
  
  IVar1 = pnga_ndim(in_stack_000001b0);
  local_48 = *in_R9 - *in_RSI;
  for (local_34 = 1; local_34 < (int)IVar1; local_34 = local_34 + 1) {
    local_48 = (in_R9[local_34] - in_RSI[local_34]) * *(long *)(in_R8 + (long)(local_34 + -1) * 8) +
               local_48;
  }
  return (int)(local_48 == (off - in_RCX) / _ndims);
}

Assistant:

static int putn_verify_element_in_buf(Integer g_a, Integer *lo, Integer *hi, void *buf,
				      Integer *ld, Integer *ecoords, void *bufn,
				      Integer elemSize)
{
  int i, ndims;
#if HAVE_STDDEF_H
  ptrdiff_t off = (char *)bufn - (char *)buf;
#else
  Integer off = (char *)bufn - (char *)buf;
#endif
  Integer eoff = 0;

  off /= elemSize; /* Offset in terms of elements */

  ndims = pnga_ndim(g_a);
  eoff = ecoords[0] - lo[0];

  /* Check in Fortran ordering */
  for (i = 1; i < ndims; i++)
    eoff += (ecoords[i] - lo[i]) * ld[i - 1];

  return (eoff == (Integer)off); /* Must be the same for a correct notify buffer */
}